

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Huffman.cpp
# Opt level: O3

void __thiscall HuffmanDecoder::run(HuffmanDecoder *this)

{
  size_t *psVar1;
  list<std::shared_ptr<HuffmanNode>,_std::allocator<std::shared_ptr<HuffmanNode>_>_> *this_00;
  _Rb_tree_header *p_Var2;
  char cVar3;
  int iVar4;
  pointer pcVar5;
  _List_node_base *p_Var6;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_01;
  __shared_count<(__gnu_cxx::_Lock_policy)2> this_02;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var7;
  element_type *peVar8;
  int iVar9;
  int *piVar10;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var11;
  long lVar12;
  long lVar13;
  mapped_type *pmVar14;
  _Node *p_Var15;
  _Base_ptr p_Var16;
  HuffmanNode *pHVar17;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var18;
  undefined8 uVar19;
  undefined1 *puVar20;
  element_type *peVar21;
  iterator iVar22;
  bool bVar23;
  value_type root;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> s_freq;
  shared_ptr<HuffmanNode> parent;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> s_amount;
  map<char,_int,_std::less<char>,_std::allocator<std::pair<const_char,_int>_>_> symbols;
  stringstream output;
  undefined1 *local_290;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_288;
  shared_ptr<HuffmanNode> local_280;
  undefined1 local_270 [16];
  shared_ptr<HuffmanNode> local_260;
  HuffmanNode local_250;
  HuffmanNode *local_228 [2];
  undefined1 local_218 [16];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_208;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> local_1f8;
  _Rb_tree<char,_std::pair<const_char,_int>,_std::_Select1st<std::pair<const_char,_int>_>,_std::less<char>,_std::allocator<std::pair<const_char,_int>_>_>
  local_1e8;
  shared_ptr<HuffmanNode> local_1b8;
  HuffmanNode local_1a8 [2];
  ios_base local_138 [264];
  
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"Huffman decryption...",0x15);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x68);
  std::ostream::put(-0x68);
  std::ostream::flush();
  pcVar5 = (this->super_Cryptor).in_message_._M_dataplus._M_p;
  local_1b8.super___shared_ptr<HuffmanNode,_(__gnu_cxx::_Lock_policy)2>._M_ptr = local_1a8;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_1b8,pcVar5,pcVar5 + (this->super_Cryptor).in_message_._M_string_length
            );
  std::__cxx11::string::substr((ulong)local_228,(ulong)&local_1b8);
  if (local_1b8.super___shared_ptr<HuffmanNode,_(__gnu_cxx::_Lock_policy)2>._M_ptr != local_1a8) {
    operator_delete(local_1b8.super___shared_ptr<HuffmanNode,_(__gnu_cxx::_Lock_policy)2>._M_ptr,
                    local_1a8[0]._0_8_ + 1);
  }
  pHVar17 = local_228[0];
  piVar10 = __errno_location();
  iVar4 = *piVar10;
  *piVar10 = 0;
  p_Var11 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
            strtol(&pHVar17->c_,(char **)&local_1b8,2);
  if (local_1b8.super___shared_ptr<HuffmanNode,_(__gnu_cxx::_Lock_policy)2>._M_ptr == pHVar17) {
LAB_00109093:
    std::__throw_invalid_argument("stoi");
  }
  else {
    iVar9 = (int)p_Var11;
    local_250.left_.super___shared_ptr<HuffmanNode,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
         p_Var11;
    if (((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)(long)iVar9 == p_Var11) &&
       (*piVar10 != 0x22)) {
      if (*piVar10 == 0) {
        *piVar10 = iVar4;
      }
      local_1e8._M_impl.super__Rb_tree_header._M_header._M_left =
           &local_1e8._M_impl.super__Rb_tree_header._M_header;
      local_1e8._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
      local_1e8._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
      local_1e8._M_impl.super__Rb_tree_header._M_node_count = 0;
      local_1e8._M_impl.super__Rb_tree_header._M_header._M_right =
           local_1e8._M_impl.super__Rb_tree_header._M_header._M_left;
      if (0 < iVar9) {
        local_250.right_.super___shared_ptr<HuffmanNode,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
             (element_type *)(ulong)(uint)(iVar9 * 2);
        peVar21 = (element_type *)0x0;
        do {
          pcVar5 = (this->super_Cryptor).in_message_._M_dataplus._M_p;
          local_280.super___shared_ptr<HuffmanNode,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
               (HuffmanNode *)local_270;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_280,pcVar5,
                     pcVar5 + (this->super_Cryptor).in_message_._M_string_length);
          std::__cxx11::string::substr((ulong)&local_1b8,(ulong)&local_280);
          if (local_280.super___shared_ptr<HuffmanNode,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
              (HuffmanNode *)local_270) {
            operator_delete(local_280.super___shared_ptr<HuffmanNode,_(__gnu_cxx::_Lock_policy)2>.
                            _M_ptr,local_270._0_8_ + 1);
          }
          local_260.super___shared_ptr<HuffmanNode,_(__gnu_cxx::_Lock_policy)2>._M_ptr = &local_250;
          pcVar5 = (this->super_Cryptor).in_message_._M_dataplus._M_p;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_260,pcVar5,
                     pcVar5 + (this->super_Cryptor).in_message_._M_string_length);
          std::__cxx11::string::substr((ulong)&local_280,(ulong)&local_260);
          local_250.right_.super___shared_ptr<HuffmanNode,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
          _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)peVar21;
          if (local_260.super___shared_ptr<HuffmanNode,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
              &local_250) {
            operator_delete(local_260.super___shared_ptr<HuffmanNode,_(__gnu_cxx::_Lock_policy)2>.
                            _M_ptr,(ulong)((long)(_func_int ***)local_250._0_8_ + 1));
          }
          peVar21 = local_280.super___shared_ptr<HuffmanNode,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
          iVar4 = *piVar10;
          *piVar10 = 0;
          lVar12 = strtol(&(local_280.super___shared_ptr<HuffmanNode,_(__gnu_cxx::_Lock_policy)2>.
                           _M_ptr)->c_,(char **)&local_260,2);
          peVar8 = local_1b8.super___shared_ptr<HuffmanNode,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
          if (local_260.super___shared_ptr<HuffmanNode,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
              peVar21) {
LAB_0010907b:
            std::__throw_invalid_argument("stoi");
LAB_00109087:
            std::__throw_out_of_range("stoi");
            goto LAB_00109093;
          }
          if ((lVar12 - 0x80000000U < 0xffffffff00000000) || (iVar9 = *piVar10, iVar9 == 0x22))
          goto LAB_00109087;
          if (iVar9 == 0) {
            *piVar10 = iVar4;
            iVar9 = iVar4;
          }
          *piVar10 = 0;
          lVar13 = strtol(&(local_1b8.super___shared_ptr<HuffmanNode,_(__gnu_cxx::_Lock_policy)2>.
                           _M_ptr)->c_,(char **)&local_260,2);
          if (local_260.super___shared_ptr<HuffmanNode,_(__gnu_cxx::_Lock_policy)2>._M_ptr == peVar8
             ) {
            std::__throw_invalid_argument("stoi");
LAB_0010906f:
            std::__throw_out_of_range("stoi");
            goto LAB_0010907b;
          }
          if ((lVar13 - 0x80000000U < 0xffffffff00000000) || (*piVar10 == 0x22)) goto LAB_0010906f;
          if (*piVar10 == 0) {
            *piVar10 = iVar9;
          }
          local_290 = (undefined1 *)CONCAT71(local_290._1_7_,(char)lVar13);
          pmVar14 = std::
                    map<char,_int,_std::less<char>,_std::allocator<std::pair<const_char,_int>_>_>::
                    operator[]((map<char,_int,_std::less<char>,_std::allocator<std::pair<const_char,_int>_>_>
                                *)&local_1e8,(key_type *)&local_290);
          *pmVar14 = (mapped_type)lVar12;
          if (local_280.super___shared_ptr<HuffmanNode,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
              (HuffmanNode *)local_270) {
            operator_delete(local_280.super___shared_ptr<HuffmanNode,_(__gnu_cxx::_Lock_policy)2>.
                            _M_ptr,local_270._0_8_ + 1);
          }
          _Var7._M_pi = local_250.right_.super___shared_ptr<HuffmanNode,_(__gnu_cxx::_Lock_policy)2>
                        ._M_refcount._M_pi;
          if (local_1b8.super___shared_ptr<HuffmanNode,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
              local_1a8) {
            operator_delete(local_1b8.super___shared_ptr<HuffmanNode,_(__gnu_cxx::_Lock_policy)2>.
                            _M_ptr,local_1a8[0]._0_8_ + 1);
          }
          peVar21 = (element_type *)((long)&(_Var7._M_pi)->_vptr__Sp_counted_base + 2);
        } while (peVar21 < local_250.right_.
                           super___shared_ptr<HuffmanNode,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
        p_Var2 = &local_1e8._M_impl.super__Rb_tree_header;
        if ((_Rb_tree_header *)local_1e8._M_impl.super__Rb_tree_header._M_header._M_left != p_Var2)
        {
          p_Var16 = local_1e8._M_impl.super__Rb_tree_header._M_header._M_left;
          do {
            local_1b8.super___shared_ptr<HuffmanNode,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
                 (element_type *)operator_new(0x28);
            iVar4 = *(int *)&p_Var16[1].field_0x4;
            (local_1b8.super___shared_ptr<HuffmanNode,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->c_ =
                 (char)p_Var16[1]._M_color;
            (local_1b8.super___shared_ptr<HuffmanNode,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->n_ =
                 iVar4;
            ((local_1b8.super___shared_ptr<HuffmanNode,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->left_).
            super___shared_ptr<HuffmanNode,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)0x0
            ;
            ((local_1b8.super___shared_ptr<HuffmanNode,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->left_).
            super___shared_ptr<HuffmanNode,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
                 (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
            ((local_1b8.super___shared_ptr<HuffmanNode,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->right_)
            .super___shared_ptr<HuffmanNode,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
                 (element_type *)0x0;
            ((local_1b8.super___shared_ptr<HuffmanNode,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->right_)
            .super___shared_ptr<HuffmanNode,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
                 (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
            std::__shared_count<(__gnu_cxx::_Lock_policy)2>::__shared_count<HuffmanNode*>
                      (&local_1b8.super___shared_ptr<HuffmanNode,_(__gnu_cxx::_Lock_policy)2>.
                        _M_refcount,
                       local_1b8.super___shared_ptr<HuffmanNode,_(__gnu_cxx::_Lock_policy)2>._M_ptr)
            ;
            p_Var15 = std::__cxx11::
                      list<std::shared_ptr<HuffmanNode>,std::allocator<std::shared_ptr<HuffmanNode>>>
                      ::_M_create_node<std::shared_ptr<HuffmanNode>const&>
                                ((list<std::shared_ptr<HuffmanNode>,std::allocator<std::shared_ptr<HuffmanNode>>>
                                  *)&this->nodes_,&local_1b8);
            std::__detail::_List_node_base::_M_hook(&p_Var15->super__List_node_base);
            psVar1 = &(this->nodes_).
                      super__List_base<std::shared_ptr<HuffmanNode>,_std::allocator<std::shared_ptr<HuffmanNode>_>_>
                      ._M_impl._M_node._M_size;
            *psVar1 = *psVar1 + 1;
            if (local_1b8.super___shared_ptr<HuffmanNode,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                        (local_1b8.super___shared_ptr<HuffmanNode,_(__gnu_cxx::_Lock_policy)2>.
                         _M_refcount._M_pi);
            }
            p_Var16 = (_Base_ptr)std::_Rb_tree_increment(p_Var16);
          } while ((_Rb_tree_header *)p_Var16 != p_Var2);
        }
      }
      this_00 = &this->nodes_;
      if (1 < (this->nodes_).
              super__List_base<std::shared_ptr<HuffmanNode>,_std::allocator<std::shared_ptr<HuffmanNode>_>_>
              ._M_impl._M_node._M_size) {
        do {
          std::__cxx11::
          list<std::shared_ptr<HuffmanNode>,_std::allocator<std::shared_ptr<HuffmanNode>_>_>::
          sort<HuffmanComparator>(this_00);
          iVar22._M_node =
               (this_00->
               super__List_base<std::shared_ptr<HuffmanNode>,_std::allocator<std::shared_ptr<HuffmanNode>_>_>
               )._M_impl._M_node.super__List_node_base._M_next;
          local_1b8.super___shared_ptr<HuffmanNode,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
               (element_type *)iVar22._M_node[1]._M_next;
          local_1b8.super___shared_ptr<HuffmanNode,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
               (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)iVar22._M_node[1]._M_prev;
          if (local_1b8.super___shared_ptr<HuffmanNode,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
              _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            if (__libc_single_threaded == '\0') {
              LOCK();
              (local_1b8.super___shared_ptr<HuffmanNode,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
              _M_pi)->_M_use_count =
                   (local_1b8.super___shared_ptr<HuffmanNode,_(__gnu_cxx::_Lock_policy)2>.
                    _M_refcount._M_pi)->_M_use_count + 1;
              UNLOCK();
              iVar22._M_node =
                   (this_00->
                   super__List_base<std::shared_ptr<HuffmanNode>,_std::allocator<std::shared_ptr<HuffmanNode>_>_>
                   )._M_impl._M_node.super__List_node_base._M_next;
            }
            else {
              (local_1b8.super___shared_ptr<HuffmanNode,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
              _M_pi)->_M_use_count =
                   (local_1b8.super___shared_ptr<HuffmanNode,_(__gnu_cxx::_Lock_policy)2>.
                    _M_refcount._M_pi)->_M_use_count + 1;
            }
          }
          std::__cxx11::
          list<std::shared_ptr<HuffmanNode>,_std::allocator<std::shared_ptr<HuffmanNode>_>_>::
          _M_erase(this_00,iVar22);
          iVar22._M_node =
               (this_00->
               super__List_base<std::shared_ptr<HuffmanNode>,_std::allocator<std::shared_ptr<HuffmanNode>_>_>
               )._M_impl._M_node.super__List_node_base._M_next;
          local_280.super___shared_ptr<HuffmanNode,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
               (element_type *)iVar22._M_node[1]._M_next;
          local_280.super___shared_ptr<HuffmanNode,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
               (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)iVar22._M_node[1]._M_prev;
          if (local_280.super___shared_ptr<HuffmanNode,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
              _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            if (__libc_single_threaded == '\0') {
              LOCK();
              (local_280.super___shared_ptr<HuffmanNode,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
              _M_pi)->_M_use_count =
                   (local_280.super___shared_ptr<HuffmanNode,_(__gnu_cxx::_Lock_policy)2>.
                    _M_refcount._M_pi)->_M_use_count + 1;
              UNLOCK();
              iVar22._M_node =
                   (this_00->
                   super__List_base<std::shared_ptr<HuffmanNode>,_std::allocator<std::shared_ptr<HuffmanNode>_>_>
                   )._M_impl._M_node.super__List_node_base._M_next;
            }
            else {
              (local_280.super___shared_ptr<HuffmanNode,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
              _M_pi)->_M_use_count =
                   (local_280.super___shared_ptr<HuffmanNode,_(__gnu_cxx::_Lock_policy)2>.
                    _M_refcount._M_pi)->_M_use_count + 1;
            }
          }
          std::__cxx11::
          list<std::shared_ptr<HuffmanNode>,_std::allocator<std::shared_ptr<HuffmanNode>_>_>::
          _M_erase(this_00,iVar22);
          pHVar17 = (HuffmanNode *)operator_new(0x28);
          HuffmanNode::HuffmanNode(pHVar17,&local_1b8,&local_280);
          local_260.super___shared_ptr<HuffmanNode,_(__gnu_cxx::_Lock_policy)2>._M_ptr = pHVar17;
          std::__shared_count<(__gnu_cxx::_Lock_policy)2>::__shared_count<HuffmanNode*>
                    (&local_260.super___shared_ptr<HuffmanNode,_(__gnu_cxx::_Lock_policy)2>.
                      _M_refcount,pHVar17);
          p_Var15 = std::__cxx11::
                    list<std::shared_ptr<HuffmanNode>,std::allocator<std::shared_ptr<HuffmanNode>>>
                    ::_M_create_node<std::shared_ptr<HuffmanNode>const&>
                              ((list<std::shared_ptr<HuffmanNode>,std::allocator<std::shared_ptr<HuffmanNode>>>
                                *)this_00,&local_260);
          std::__detail::_List_node_base::_M_hook(&p_Var15->super__List_node_base);
          psVar1 = &(this->nodes_).
                    super__List_base<std::shared_ptr<HuffmanNode>,_std::allocator<std::shared_ptr<HuffmanNode>_>_>
                    ._M_impl._M_node._M_size;
          *psVar1 = *psVar1 + 1;
          if ((element_type *)
              local_260.super___shared_ptr<HuffmanNode,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
              _M_pi != (element_type *)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                      (local_260.super___shared_ptr<HuffmanNode,_(__gnu_cxx::_Lock_policy)2>.
                       _M_refcount._M_pi);
          }
          if (local_280.super___shared_ptr<HuffmanNode,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
              _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                      (local_280.super___shared_ptr<HuffmanNode,_(__gnu_cxx::_Lock_policy)2>.
                       _M_refcount._M_pi);
          }
          if (local_1b8.super___shared_ptr<HuffmanNode,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
              _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                      (local_1b8.super___shared_ptr<HuffmanNode,_(__gnu_cxx::_Lock_policy)2>.
                       _M_refcount._M_pi);
          }
        } while (1 < (this->nodes_).
                     super__List_base<std::shared_ptr<HuffmanNode>,_std::allocator<std::shared_ptr<HuffmanNode>_>_>
                     ._M_impl._M_node._M_size);
      }
      p_Var6 = (this_00->
               super__List_base<std::shared_ptr<HuffmanNode>,_std::allocator<std::shared_ptr<HuffmanNode>_>_>
               )._M_impl._M_node.super__List_node_base._M_next;
      local_290 = (undefined1 *)p_Var6[1]._M_next;
      local_288._M_pi = *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)((long)(p_Var6 + 1) + 8);
      if (local_288._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        if (__libc_single_threaded == '\0') {
          LOCK();
          (local_288._M_pi)->_M_use_count = (local_288._M_pi)->_M_use_count + 1;
          UNLOCK();
        }
        else {
          (local_288._M_pi)->_M_use_count = (local_288._M_pi)->_M_use_count + 1;
        }
      }
      std::__cxx11::stringstream::stringstream((stringstream *)&local_1b8);
      local_260.super___shared_ptr<HuffmanNode,_(__gnu_cxx::_Lock_policy)2>._M_ptr = &local_250;
      pcVar5 = (this->super_Cryptor).in_message_._M_dataplus._M_p;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_260,pcVar5,
                 pcVar5 + (this->super_Cryptor).in_message_._M_string_length);
      std::__cxx11::string::substr((ulong)&local_280,(ulong)&local_260);
      if (local_260.super___shared_ptr<HuffmanNode,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
          (element_type *)&local_250) {
        operator_delete(local_260.super___shared_ptr<HuffmanNode,_(__gnu_cxx::_Lock_policy)2>._M_ptr
                        ,(ulong)((long)(_func_int ***)local_250._0_8_ + 1));
      }
      _Var7._M_pi = local_280.super___shared_ptr<HuffmanNode,_(__gnu_cxx::_Lock_policy)2>.
                    _M_refcount._M_pi;
      peVar21 = local_280.super___shared_ptr<HuffmanNode,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      if (local_280.super___shared_ptr<HuffmanNode,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
          (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        p_Var11 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
        do {
          this_02._M_pi = local_288._M_pi;
          cVar3 = *(char *)((long)&p_Var11->_vptr__Sp_counted_base + (long)&peVar21->c_);
          if (cVar3 == '1') {
            puVar20 = *(undefined1 **)(local_290 + 0x18);
            p_Var18 = *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)(local_290 + 0x20);
LAB_00108e3b:
            if (p_Var18 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              if (__libc_single_threaded == '\0') {
                LOCK();
                p_Var18->_M_use_count = p_Var18->_M_use_count + 1;
                UNLOCK();
              }
              else {
                p_Var18->_M_use_count = p_Var18->_M_use_count + 1;
              }
            }
            bVar23 = local_288._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
            local_290 = puVar20;
            local_288._M_pi = p_Var18;
            if (bVar23) {
              std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_02._M_pi);
            }
          }
          else if (cVar3 == '0') {
            puVar20 = *(undefined1 **)(local_290 + 8);
            p_Var18 = *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)(local_290 + 0x10);
            goto LAB_00108e3b;
          }
          lVar12 = *(long *)(local_290 + 0x18);
          p_Var18 = *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)(local_290 + 0x20);
          if (p_Var18 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            if (__libc_single_threaded == '\0') {
              LOCK();
              p_Var18->_M_use_count = p_Var18->_M_use_count + 1;
              UNLOCK();
            }
            else {
              p_Var18->_M_use_count = p_Var18->_M_use_count + 1;
            }
          }
          if (lVar12 == 0) {
            lVar12 = *(long *)(local_290 + 8);
            this_01 = *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)(local_290 + 0x10);
            if (this_01 == (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              bVar23 = lVar12 == 0;
            }
            else {
              if (__libc_single_threaded == '\0') {
                LOCK();
                this_01->_M_use_count = this_01->_M_use_count + 1;
                UNLOCK();
              }
              else {
                this_01->_M_use_count = this_01->_M_use_count + 1;
              }
              bVar23 = lVar12 == 0;
              std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_01);
            }
          }
          else {
            bVar23 = false;
          }
          if (p_Var18 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var18);
          }
          if (bVar23) {
            local_260.super___shared_ptr<HuffmanNode,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
                 (element_type *)
                 CONCAT71(local_260.super___shared_ptr<HuffmanNode,_(__gnu_cxx::_Lock_policy)2>.
                          _M_ptr._1_7_,*local_290);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)local_1a8,(char *)&local_260,1);
            std::ostream::flush();
            p_Var6 = (this_00->
                     super__List_base<std::shared_ptr<HuffmanNode>,_std::allocator<std::shared_ptr<HuffmanNode>_>_>
                     )._M_impl._M_node.super__List_node_base._M_next;
            local_290 = (undefined1 *)p_Var6[1]._M_next;
            std::__shared_count<(__gnu_cxx::_Lock_policy)2>::operator=
                      (&local_288,
                       (__shared_count<(__gnu_cxx::_Lock_policy)2> *)((long)(p_Var6 + 1) + 8));
          }
          p_Var11 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                    ((long)&p_Var11->_vptr__Sp_counted_base + 1);
        } while (_Var7._M_pi != p_Var11);
      }
      if (local_280.super___shared_ptr<HuffmanNode,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
          (HuffmanNode *)local_270) {
        operator_delete(local_280.super___shared_ptr<HuffmanNode,_(__gnu_cxx::_Lock_policy)2>._M_ptr
                        ,local_270._0_8_ + 1);
      }
      std::__cxx11::stringbuf::str();
      std::__cxx11::string::operator=
                ((string *)&(this->super_Cryptor).out_message_,(string *)&local_208);
      if (local_208._M_pi != &local_1f8) {
        operator_delete(local_208._M_pi,
                        (ulong)((long)(_func_int ***)local_1f8._vptr__Sp_counted_base + 1));
      }
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cout,"decryption done!",0x10);
      std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x68);
      std::ostream::put(-0x68);
      std::ostream::flush();
      std::__cxx11::stringstream::~stringstream((stringstream *)&local_1b8);
      std::ios_base::~ios_base(local_138);
      if (local_288._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_288._M_pi);
      }
      std::
      _Rb_tree<char,_std::pair<const_char,_int>,_std::_Select1st<std::pair<const_char,_int>_>,_std::less<char>,_std::allocator<std::pair<const_char,_int>_>_>
      ::~_Rb_tree(&local_1e8);
      if (local_228[0] != (HuffmanNode *)local_218) {
        operator_delete(local_228[0],local_218._0_8_ + 1);
      }
      return;
    }
  }
  uVar19 = std::__throw_out_of_range("stoi");
  if (local_260.super___shared_ptr<HuffmanNode,_(__gnu_cxx::_Lock_policy)2>._M_ptr != &local_250) {
    operator_delete(local_260.super___shared_ptr<HuffmanNode,_(__gnu_cxx::_Lock_policy)2>._M_ptr,
                    (ulong)((long)(_func_int ***)local_250._0_8_ + 1));
  }
  std::__cxx11::stringstream::~stringstream((stringstream *)&local_1b8);
  std::ios_base::~ios_base(local_138);
  if (local_288._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_288._M_pi);
  }
  std::
  _Rb_tree<char,_std::pair<const_char,_int>,_std::_Select1st<std::pair<const_char,_int>_>,_std::less<char>,_std::allocator<std::pair<const_char,_int>_>_>
  ::~_Rb_tree(&local_1e8);
  if (local_228[0] != (HuffmanNode *)local_218) {
    operator_delete(local_228[0],local_218._0_8_ + 1);
  }
  _Unwind_Resume(uVar19);
}

Assistant:

void HuffmanDecoder::run() {
  cout << "Huffman decryption..." << endl;

  const auto s_amount = get_in_message().substr(0, 8);
  const auto amount = stoi(s_amount, nullptr, 2);
  map<char, int> symbols;
  for (auto i = 0; i < amount * 2; i += 2) {
    const auto char_index = 8 * (i + 1);
    const auto freq_index = 8 * (i + 2);
    auto s_char = get_in_message().substr(static_cast<unsigned long>(char_index), 8);
    auto s_freq = get_in_message().substr(static_cast<unsigned long>(freq_index), 8);
    symbols[stoi(s_char, nullptr, 2)] = stoi(s_freq, nullptr, 2);
  }

  for (auto& symbol : symbols) {
    shared_ptr<HuffmanNode> node(new HuffmanNode(symbol.first, symbol.second));
    nodes_.push_back(node);
  }

  //building the tree
  while (nodes_.size() > 1) {
    nodes_.sort(HuffmanComparator());

    auto left_son = nodes_.front();
    nodes_.pop_front();
    auto right_son = nodes_.front();
    nodes_.pop_front();

    shared_ptr<HuffmanNode> parent(new HuffmanNode(left_son, right_son));
    nodes_.push_back(parent);
  }

  auto root = nodes_.front();

  stringstream output;
  //saving decoded message
  for (auto& c : get_in_message().substr(static_cast<unsigned long>(amount * 16 + 8))) {
    if (c == '0') {
      root = root->get_left();
    }
    else if (c == '1') {
      root = root->get_right();
    }

    if (root->get_right() == nullptr &&
      root->get_left() == nullptr) {
      output << root->get_c() << flush;
      root = nodes_.front();
    }
  }
  set_out_message(output.str());

  cout << "decryption done!" << endl;
}